

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalKdevelopGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalKdevelopGenerator *this)

{
  cmGlobalKdevelopGenerator *this_local;
  
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const
                          { return cmGlobalKdevelopGenerator::GetActualName();}